

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void DC4_C(uint8_t *dst)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  
  pbVar3 = dst + -0x20;
  uVar1 = 4;
  lVar4 = -1;
  do {
    uVar1 = (uint)dst[lVar4] + *pbVar3 + uVar1;
    pbVar3 = pbVar3 + 1;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x7f);
  iVar2 = (uVar1 >> 3 & 0xff) * 0x1010101;
  *(int *)dst = iVar2;
  *(int *)(dst + 0x20) = iVar2;
  *(int *)(dst + 0x40) = iVar2;
  *(int *)(dst + 0x60) = iVar2;
  return;
}

Assistant:

static void DC4_C(uint8_t* dst) {   // DC
  uint32_t dc = 4;
  int i;
  for (i = 0; i < 4; ++i) dc += dst[i - BPS] + dst[-1 + i * BPS];
  dc >>= 3;
  for (i = 0; i < 4; ++i) memset(dst + i * BPS, dc, 4);
}